

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall flatbuffers::cpp::CppGenerator::GenMember(CppGenerator *this,FieldDef *field)

{
  SymbolTable<flatbuffers::Value> *this_00;
  Value *type_00;
  CodeWriter *this_01;
  BaseType BVar1;
  Value *pVVar2;
  string *this_02;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  string field_di;
  string local_88;
  string local_68;
  string type;
  
  if (field->deprecated != false) {
    return;
  }
  BVar1 = (field->value).type.base_type;
  if (BVar1 == BASE_TYPE_UTYPE) {
    return;
  }
  if (((BVar1 - BASE_TYPE_VECTOR & 0xfffffffb) == 0) &&
     ((field->value).type.element == BASE_TYPE_UTYPE)) {
    return;
  }
  type_00 = &field->value;
  GenTypeNative_abi_cxx11_(&type,this,&type_00->type,false,field,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"cpp_type",(allocator<char> *)&field_di);
  this_00 = &(field->super_Definition).attributes;
  pVVar2 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (pVVar2 == (Value *)0x0) {
    std::operator+(&local_88,&type," ");
  }
  else {
    BVar1 = (type_00->type).base_type;
    if ((BVar1 == BASE_TYPE_VECTOR64) || (BVar1 == BASE_TYPE_VECTOR)) {
      GenTypeNativePtr(&local_e8,this,&pVVar2->constant,field,false);
      std::operator+(&field_di,"std::vector<",&local_e8);
      std::operator+(&local_88,&field_di,"> ");
      std::__cxx11::string::~string((string *)&field_di);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    else {
      GenTypeNativePtr(&local_88,this,&pVVar2->constant,field,false);
    }
  }
  field_di._M_dataplus._M_p = (pointer)&field_di.field_2;
  field_di._M_string_length = 0;
  field_di.field_2._M_local_buf[0] = '\0';
  if (0 < *(int *)&(this->opts_).super_IDLOptions.field_0x30c) {
    std::__cxx11::string::assign((char *)&field_di);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"native_default",(allocator<char> *)&local_c8);
    pVVar2 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    BVar1 = (type_00->type).base_type;
    if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
      if (pVVar2 == (Value *)0x0) {
        GetDefaultScalarValue_abi_cxx11_(&local_c8,this,field,true);
      }
      else {
        std::__cxx11::string::string((string *)&local_c8,(string *)&pVVar2->constant);
      }
      std::operator+(&local_e8," = ",&local_c8);
      std::__cxx11::string::operator=((string *)&field_di,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      this_02 = &local_c8;
    }
    else {
      if (((BVar1 != BASE_TYPE_STRUCT) || (pVVar2 == (Value *)0x0)) ||
         (((field->value).type.struct_def)->fixed == false)) goto LAB_00169e41;
      std::operator+(&local_e8," = ",&pVVar2->constant);
      this_02 = &local_e8;
      std::__cxx11::string::operator=((string *)&field_di,(string *)this_02);
    }
    std::__cxx11::string::~string((string *)this_02);
  }
LAB_00169e41:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"FIELD_TYPE",(allocator<char> *)&local_c8);
  this_01 = &this->code_;
  CodeWriter::SetValue(this_01,&local_e8,&local_88);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"FIELD_NAME",&local_e9);
  Name_abi_cxx11_(&local_c8,this,field);
  CodeWriter::SetValue(this_01,&local_e8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"FIELD_DI",(allocator<char> *)&local_c8);
  CodeWriter::SetValue(this_01,&local_e8,&field_di);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"  {{FIELD_TYPE}}{{FIELD_NAME}}{{FIELD_DI}};",
             (allocator<char> *)&local_e8);
  CodeWriter::operator+=(this_01,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&field_di);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void GenMember(const FieldDef &field) {
    if (!field.deprecated &&  // Deprecated fields won't be accessible.
        field.value.type.base_type != BASE_TYPE_UTYPE &&
        (!IsVector(field.value.type) ||
         field.value.type.element != BASE_TYPE_UTYPE)) {
      auto type = GenTypeNative(field.value.type, false, field);
      auto cpp_type = field.attributes.Lookup("cpp_type");
      const std::string &full_type =
          (cpp_type
               ? (IsVector(field.value.type)
                      ? "std::vector<" +
                            GenTypeNativePtr(cpp_type->constant, &field,
                                             false) +
                            "> "
                      : GenTypeNativePtr(cpp_type->constant, &field, false))
               : type + " ");
      // Generate default member initializers for >= C++11.
      std::string field_di;
      if (opts_.g_cpp_std >= cpp::CPP_STD_11) {
        field_di = "{}";
        auto native_default = field.attributes.Lookup("native_default");
        // Scalar types get parsed defaults, raw pointers get nullptrs.
        if (IsScalar(field.value.type.base_type)) {
          field_di =
              " = " + (native_default ? std::string(native_default->constant)
                                      : GetDefaultScalarValue(field, true));
        } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
          if (IsStruct(field.value.type) && native_default) {
            field_di = " = " + native_default->constant;
          }
        }
      }
      code_.SetValue("FIELD_TYPE", full_type);
      code_.SetValue("FIELD_NAME", Name(field));
      code_.SetValue("FIELD_DI", field_di);
      code_ += "  {{FIELD_TYPE}}{{FIELD_NAME}}{{FIELD_DI}};";
    }
  }